

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O0

shared_ptr<MyCompiler::Condition> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Condition>(RecursiveDescentParser *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  shared_ptr<MyCompiler::Condition> sVar3;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [32];
  undefined1 local_30 [32];
  RecursiveDescentParser *this_local;
  shared_ptr<MyCompiler::Condition> *pResult;
  
  local_30[0x17] = 0;
  this_local = this;
  std::make_shared<MyCompiler::Condition>();
  if (*(int *)(in_RSI + 0x30) == 0x1f) {
    peVar1 = std::
             __shared_ptr_access<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    (peVar1->super_AbstractAstNode).caseNum = 1;
    parse<MyCompiler::Expression>((RecursiveDescentParser *)local_30);
    peVar1 = std::
             __shared_ptr_access<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::shared_ptr<MyCompiler::Expression>::operator=
              (&peVar1->pExpression1,(shared_ptr<MyCompiler::Expression> *)local_30);
    std::shared_ptr<MyCompiler::Expression>::~shared_ptr
              ((shared_ptr<MyCompiler::Expression> *)local_30);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    peVar1 = std::
             __shared_ptr_access<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    (peVar1->super_AbstractAstNode).caseNum = 0;
    parse<MyCompiler::Expression>((RecursiveDescentParser *)local_50);
    peVar1 = std::
             __shared_ptr_access<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::shared_ptr<MyCompiler::Expression>::operator=
              (&peVar1->pExpression1,(shared_ptr<MyCompiler::Expression> *)local_50);
    std::shared_ptr<MyCompiler::Expression>::~shared_ptr
              ((shared_ptr<MyCompiler::Expression> *)local_50);
    parse<MyCompiler::RelOp>((RecursiveDescentParser *)local_60);
    peVar1 = std::
             __shared_ptr_access<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::shared_ptr<MyCompiler::RelOp>::operator=
              (&peVar1->pRelOp,(shared_ptr<MyCompiler::RelOp> *)local_60);
    std::shared_ptr<MyCompiler::RelOp>::~shared_ptr((shared_ptr<MyCompiler::RelOp> *)local_60);
    parse<MyCompiler::Expression>((RecursiveDescentParser *)local_70);
    peVar1 = std::
             __shared_ptr_access<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::shared_ptr<MyCompiler::Expression>::operator=
              (&peVar1->pExpression2,(shared_ptr<MyCompiler::Expression> *)local_70);
    std::shared_ptr<MyCompiler::Expression>::~shared_ptr
              ((shared_ptr<MyCompiler::Expression> *)local_70);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Condition>)
         sVar3.super___shared_ptr<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Condition> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Condition>();

    if (sym == SymbolType::ODD)
    {
        pResult->caseNum = 1;
        pResult->pExpression1 = parse<Expression>();
    }
    else
    {
        pResult->caseNum = 0;
        pResult->pExpression1 = parse<Expression>();
        pResult->pRelOp = parse<RelOp>();
        pResult->pExpression2 = parse<Expression>();
    }

    return pResult;
}